

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_MappedFile.cpp
# Opt level: O1

bool __thiscall axl::io::MappedFile::duplicate(MappedFile *this,Handle fileHandle,uint_t flags)

{
  bool bVar1;
  
  close(this,fileHandle);
  bVar1 = File::duplicate(&this->m_file,fileHandle);
  if (bVar1) {
    this->m_fileFlags = flags;
  }
  return bVar1;
}

Assistant:

bool
MappedFile::duplicate(
	File::Handle fileHandle,
	uint_t flags
) {
	close();

	bool result = m_file.duplicate(fileHandle);
	if (!result)
		return false;

	m_fileFlags = flags;
	return true;
}